

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O3

ssize_t __thiscall Kvm::read(Kvm *this,int __fd,void *__buf,size_t __nbytes)

{
  Kgc *this_00;
  pointer *ppppVVar1;
  Value *pVVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  istream *piVar6;
  Value *pVVar7;
  ostream *poVar8;
  _func_int **pp_Var9;
  Value *pVVar10;
  runtime_error *prVar11;
  uint uVar12;
  ulong uVar13;
  void *__buf_00;
  byte bVar14;
  undefined4 in_register_00000034;
  Kvm *in;
  char cVar15;
  Kvm *pKVar16;
  long lVar17;
  long lVar18;
  char c;
  string buffer;
  byte local_79;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Kvm *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  in = (Kvm *)CONCAT44(in_register_00000034,__fd);
  anon_unknown.dwarf_ec09::eatWhitespace((istream *)in);
  std::operator>>((istream *)in,(char *)&local_79);
  if ((*(byte *)((long)&(in->interned_strings)._M_h._M_buckets[-3]->_M_nxt +
                (long)&(in->interned_strings)._M_h._M_rehash_policy._M_max_load_factor) & 5) != 0) {
    return (ssize_t)(Value *)0x0;
  }
  if ((char)local_79 == 0x23) {
    pKVar16 = in;
    std::operator>>((istream *)in,(char *)&local_79);
    if (local_79 == 0x5c) {
      pVVar7 = readCharacter(pKVar16,(istream *)in);
      return (ssize_t)pVVar7;
    }
    if (local_79 != 0x66) {
      if (local_79 == 0x74) {
        return (ssize_t)this->TRUE;
      }
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_78._0_8_ = local_78 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_78,"unknown boolean literal","");
      std::runtime_error::runtime_error(prVar11,(string *)local_78);
      *(undefined ***)prVar11 = &PTR__runtime_error_00113b48;
      __cxa_throw(prVar11,&(anonymous_namespace)::KatException::typeinfo,
                  std::runtime_error::~runtime_error);
    }
    return (ssize_t)this->FALSE;
  }
  uVar12 = (int)(char)local_79 - 0x30;
  uVar13 = (ulong)uVar12;
  cVar15 = (char)__fd;
  if (uVar12 < 10) {
    plVar5 = (long *)std::istream::putback(cVar15);
    uVar13 = *(ulong *)(*plVar5 + -0x18);
    if ((*(byte *)((long)plVar5 + uVar13 + 0x20) & 5) == 0) {
      lVar18 = 2;
      goto LAB_0010a51b;
    }
  }
  if (local_79 == 0x2d) {
    iVar4 = std::istream::peek();
    lVar18 = -2;
    if (iVar4 - 0x30U < 10) {
LAB_0010a51b:
      piVar6 = std::operator>>((istream *)in,(char *)&local_79);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
        lVar17 = 0;
        do {
          iVar4 = (int)(char)local_79;
          bVar14 = local_79;
          if (9 < iVar4 - 0x30U) goto LAB_0010a580;
          lVar17 = (ulong)(iVar4 - 0x30U) + lVar17 * 10;
          piVar6 = std::operator>>((istream *)in,(char *)&local_79);
        } while (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0);
      }
      else {
        lVar17 = 0;
      }
      iVar4 = (int)(char)local_79;
      bVar14 = local_79;
LAB_0010a580:
      iVar4 = isspace(iVar4);
      if ((iVar4 == 0) &&
         ((0x3b < bVar14 || ((0x800030400000000U >> ((ulong)bVar14 & 0x3f) & 1) == 0)))) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_78._0_8_ = local_78 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_78,"number not followed by delimiter","");
        std::runtime_error::runtime_error(prVar11,(string *)local_78);
        *(undefined ***)prVar11 = &PTR__runtime_error_00113b48;
        __cxa_throw(prVar11,&(anonymous_namespace)::KatException::typeinfo,
                    std::runtime_error::~runtime_error);
      }
      std::istream::putback(cVar15);
      return (ssize_t)(Value *)(lVar18 * lVar17 | 1);
    }
  }
  if (local_79 == 0x22) {
    local_78._8_8_ = 0;
    local_68._M_local_buf[0] = '\0';
    local_78._0_8_ = local_78 + 0x10;
    while ((piVar6 = std::operator>>((istream *)in,(char *)&local_79),
           ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0 && (local_79 != 0x22))
          ) {
      if (local_79 == 0x5c) {
        piVar6 = std::operator>>((istream *)in,(char *)&local_79);
        if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_50,"non-terminated string literal","");
          std::runtime_error::runtime_error(prVar11,(string *)local_50);
          *(undefined ***)prVar11 = &PTR__runtime_error_00113b48;
          __cxa_throw(prVar11,&(anonymous_namespace)::KatException::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        if (local_79 == 0x6e) {
          local_79 = 10;
        }
      }
      std::__cxx11::string::_M_replace_aux((ulong)local_78,local_78._8_8_,0,'\x01');
    }
    pVVar7 = makeString(this,(string *)local_78);
    if ((undefined1 *)local_78._0_8_ == local_78 + 0x10) {
      return (ssize_t)pVVar7;
    }
    operator_delete((void *)local_78._0_8_,
                    CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]) + 1);
    return (ssize_t)pVVar7;
  }
  local_58 = this;
  bVar3 = anon_unknown.dwarf_ec09::isInitial(local_79);
  if (bVar3) {
LAB_0010a3a1:
    local_78._0_8_ = local_78 + 0x10;
    local_78._8_8_ = 0;
    local_68._M_local_buf[0] = '\0';
    pVVar7 = (Value *)local_78;
    while( true ) {
      bVar3 = anon_unknown.dwarf_ec09::isInitial(local_79);
      bVar14 = local_79;
      if ((((!bVar3) && (9 < (int)(char)local_79 - 0x30U)) && (local_79 != 0x2d)) &&
         (uVar13 = (ulong)local_79, local_79 != 0x2b)) break;
      std::__cxx11::string::_M_replace_aux((ulong)pVVar7,local_78._8_8_,0,'\x01');
      std::operator>>((istream *)in,(char *)&local_79);
    }
    iVar4 = isspace((int)(char)local_79);
    if ((iVar4 == 0) && ((0x3b < bVar14 || ((0x800030400000000U >> (uVar13 & 0x3f) & 1) == 0)))) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"symbol not followed by delimiter. ",0x22);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Found \'",7);
      local_50[0] = (undefined1 *)CONCAT71(local_50[0]._1_7_,local_79);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_50,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'",1);
      std::endl<char,std::char_traits<char>>(poVar8);
      bVar3 = false;
    }
    else {
      std::istream::putback(cVar15);
      pVVar7 = makeSymbol(local_58,(string *)local_78);
      bVar3 = true;
    }
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,
                      CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]) + 1);
    }
    if (!bVar3) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_78._0_8_ = local_78 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"illegal read state","");
      std::runtime_error::runtime_error(prVar11,(string *)local_78);
      *(undefined ***)prVar11 = &PTR__runtime_error_00113b48;
      __cxa_throw(prVar11,&(anonymous_namespace)::KatException::typeinfo,
                  std::runtime_error::~runtime_error);
    }
  }
  else {
    if ((local_79 == 0x2d) || (local_79 == 0x2b)) {
      uVar12 = std::istream::peek();
      iVar4 = isspace((int)(char)(byte)uVar12);
      if ((iVar4 != 0) ||
         (((byte)uVar12 < 0x3c &&
          (uVar13 = 0x800030400000000, (0x800030400000000U >> ((ulong)uVar12 & 0x3f) & 1) != 0))))
      goto LAB_0010a3a1;
    }
    pKVar16 = local_58;
    if (local_79 == 0x27) {
      local_78._0_8_ = (_func_int **)0x0;
      this_00 = &local_58->gc_;
      Kgc::pushLocalStackRoot(this_00,(Value **)local_78);
      pp_Var9 = (_func_int **)read(pKVar16,__fd,__buf_00,uVar13);
      if (pp_Var9 == (_func_int **)0x0) {
        pVVar7 = (Value *)0x0;
      }
      else {
        pVVar7 = pKVar16->NIL;
        local_78._0_8_ = pp_Var9;
        pVVar10 = Kgc::allocValue(this_00,CELL);
        pVVar10[1]._vptr_Value = pp_Var9;
        *(Value **)&pVVar10[1].type_ = pVVar7;
        pVVar2 = pKVar16->QUOTE;
        local_78._0_8_ = pVVar10;
        pVVar7 = Kgc::allocValue(this_00,CELL);
        pVVar7[1]._vptr_Value = (_func_int **)pVVar2;
        *(Value **)&pVVar7[1].type_ = pVVar10;
      }
      ppppVVar1 = &(pKVar16->gc_).localStackRoots_.
                   super__Vector_base<const_Value_**,_std::allocator<const_Value_**>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      *ppppVVar1 = *ppppVVar1 + -1;
    }
    else {
      if (local_79 != 0x28) {
        local_78._0_8_ = local_78 + 0x10;
        local_78._8_8_ = 0;
        local_68._M_local_buf[0] = '\0';
        std::__cxx11::string::append(local_78);
        std::__cxx11::string::_M_replace_aux((ulong)local_78,local_78._8_8_,0,'\x01');
        std::__cxx11::string::append(local_78);
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar11,(string *)local_78);
        *(undefined ***)prVar11 = &PTR__runtime_error_00113b48;
        __cxa_throw(prVar11,&(anonymous_namespace)::KatException::typeinfo,
                    std::runtime_error::~runtime_error);
      }
      pVVar7 = readPair(local_58,(istream *)in);
    }
  }
  return (ssize_t)pVVar7;
}

Assistant:

const Value* Kvm::read(std::istream &in)
{
    eatWhitespace(in);

    int sign{1};
    long num{0};
    char c;
    in >> c;

    if (!in)
    {
        return nullptr;
    }
    if (c == '#') /* read a boolean */
    {
        in >> c;
        if (c == 't')
            return TRUE;
        else if (c == 'f')
            return FALSE;
        else if (c == '\\')
            return readCharacter(in);
        else
        {
            throw KatException("unknown boolean literal");
        }
    } else if ((isdigit(c) && in.putback(c)) ||
               (c == '-' && isdigit(in.peek()) && (sign = -1)))
    {
        /* read a fixnum */
        while (in >> c && isdigit(c))
        {
            num = num * 10 + (c - '0');
        }
        num *= sign;
        if (isDelimiter(c))
        {
            in.putback(c);
            return makeFixnum(num);
        } else
        {
            throw KatException("number not followed by delimiter");
        }
    } else if (c == '"')
    {
        string buffer;
        while (in >> c && c != '"')
        {
            if (c == '\\')
            {
                if (in >> c)
                {
                    if (c == 'n') c = '\n';
                } else
                {
                    throw KatException("non-terminated string literal");
                }
            }
            buffer.append(1, c);
        }
        return makeString(buffer);

    } else if (isInitial(c) || ((c == '+' || c == '-') && isDelimiter(in.peek()))) // FIXME: peek returns int
    {
        string symbol;
        while (isInitial(c) || isdigit(c) || c == '+' || c == '-')
        {
            symbol.append(1, c);
            in >> c;
        }
        if (isDelimiter(c))
        {
            in.putback(c);
            return makeSymbol(symbol);
        } else
        {
            cerr << "symbol not followed by delimiter. " <<
            "Found '" << c << "'" << endl;
        }
    } else if (c == '(')
    {
        return readPair(in);
    } else if (c == '\'')
    {
        const Value *result = nullptr;
        GcGuard guard{gc_};
        guard.pushLocalStackRoot(&result);
        result = read(in);
        if (!result) return nullptr;
        result = makeCell(result, NIL);
        result = makeCell(QUOTE, result);
        return result;
    } else
    {
        std::string msg;
        msg.append("bad input. unexpected '");
        msg.append(1, c);
        msg.append("'");
        throw KatException(msg);
    }
    throw KatException("illegal read state");
}